

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaft.cpp
# Opt level: O1

void __thiscall chrono::ChShaft::VariablesQbSetSpeed(ChShaft *this,double step)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double *local_28;
  long local_20;
  
  dVar1 = this->pos_dt;
  ChVariables::Get_qb((ChVectorRef *)&local_28,&(this->variables).super_ChVariables);
  if (0 < local_20) {
    dVar2 = *local_28;
    this->pos_dt = dVar2;
    if (this->limitspeed == true) {
      dVar4 = (double)this->max_speed;
      if (dVar4 < dVar2) {
        this->pos_dt = dVar4;
      }
      auVar3._8_4_ = 0x80000000;
      auVar3._0_8_ = 0x8000000080000000;
      auVar3._12_4_ = 0x80000000;
      auVar3 = vxorps_avx512vl(ZEXT416((uint)this->max_speed),auVar3);
      if (this->pos_dt < (double)auVar3._0_4_) {
        this->pos_dt = (double)auVar3._0_4_;
      }
    }
    if ((step != 0.0) || (NAN(step))) {
      this->pos_dtdt = (this->pos_dt - dVar1) / step;
    }
    return;
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
               );
}

Assistant:

void ChShaft::VariablesQbSetSpeed(double step) {
    double old_dt = pos_dt;

    // from 'qb' vector, sets body speed, and updates auxiliary data
    pos_dt = variables.Get_qb()(0);

    // apply limits (if in speed clamping mode) to speeds.
    ClampSpeed();

    // Compute accel. by BDF (approximate by differentiation);
    if (step) {
        pos_dtdt = (pos_dt - old_dt) / step;
    }
}